

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

void xm_pitch_slide(xm_context_t *ctx,xm_channel_context_t *ch,float period_offset)

{
  float fVar1;
  float fVar2;
  
  if ((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) {
    period_offset = period_offset * 4.0;
  }
  fVar1 = period_offset + ch->period;
  fVar2 = 0.0;
  if (0.0 <= fVar1) {
    fVar2 = fVar1;
  }
  ch->period = fVar2;
  xm_update_frequency(ctx,ch);
  return;
}

Assistant:

static void xm_pitch_slide(xm_context_t* ctx, xm_channel_context_t* ch, float period_offset) {
	/* Don't ask about the 4.f coefficient. I found mention of it
	 * nowhere. Found by ear™. */
	if(ctx->module.frequency_type == XM_LINEAR_FREQUENCIES) {
		period_offset *= 4.f;
	}

	ch->period += period_offset;
	XM_CLAMP_DOWN(ch->period);
	/* XXX: upper bound of period ? */

	xm_update_frequency(ctx, ch);
}